

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

bool __thiscall cfd::core::Psbt::IsFindTxInSignature(Psbt *this,uint32_t index,Pubkey *pubkey)

{
  void *pvVar1;
  CfdException *this_00;
  undefined4 in_register_00000034;
  bool bVar2;
  allocator local_6d;
  int ret;
  size_t exist;
  undefined1 local_60 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0xabb,"IsFindTxInSignature");
  pvVar1 = this->wally_psbt_pointer_;
  Pubkey::GetData((ByteData *)local_60,pubkey);
  ByteData::GetBytes(&key_vec,(ByteData *)local_60);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  exist = 0;
  ret = wally_map_find((wally_map *)(*(long *)((long)pvVar1 + 0x10) + (ulong)index * 0x110 + 0x60),
                       key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)key_vec.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)key_vec.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,&exist);
  if (ret == 0) {
    bVar2 = exist != 0;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return bVar2;
  }
  local_60._0_8_ = "cfdcore_psbt.cpp";
  local_60._8_4_ = 0xac4;
  local_60._16_8_ = "IsFindTxInSignature";
  logger::warn<int&>((CfdSourceLocation *)local_60,"wally_map_find NG[{}]",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_60,"psbt find signature key error.",&local_6d);
  CfdException::CfdException(this_00,kCfdMemoryFullError,(string *)local_60);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool Psbt::IsFindTxInSignature(uint32_t index, const Pubkey &pubkey) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  auto key_vec = pubkey.GetData().GetBytes();
  size_t exist = 0;
  int ret = wally_map_find(
      &psbt_pointer->inputs[index].signatures, key_vec.data(), key_vec.size(),
      &exist);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_find NG[{}]", ret);
    throw CfdException(kCfdMemoryFullError, "psbt find signature key error.");
  }
  return (exist == 0) ? false : true;
}